

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuReduce.c
# Opt level: O2

int Fxu_PreprocessCubePairs(Fxu_Matrix *p,Vec_Ptr_t *vCovers,int nPairsTotal,int nPairsMax)

{
  long lVar1;
  char *pcVar2;
  Fxu_Var *pFVar3;
  Fxu_Cube *pCube2;
  int iVar4;
  uint uVar5;
  int iVar6;
  void *__s;
  int *__s_00;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  Fxu_Cube *pFVar10;
  uint uVar11;
  Fxu_Cube **ppFVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char cVar16;
  ulong uVar17;
  ulong uVar18;
  Fxu_Cube *pCube1;
  int iVar19;
  long lVar20;
  bool bVar21;
  
  if (nPairsMax < nPairsTotal) {
    __s = malloc((long)nPairsTotal);
    memset(__s,0xff,(long)nPairsTotal);
    iVar8 = -1;
    iVar19 = 0;
    for (lVar20 = 0; uVar9 = (ulong)vCovers->nSize, lVar20 < (long)uVar9; lVar20 = lVar20 + 1) {
      pcVar15 = (char *)vCovers->pArray[lVar20];
      if (pcVar15 != (char *)0x0) {
        iVar4 = Abc_SopGetVarNum(pcVar15);
        uVar5 = Abc_SopGetVarNum(pcVar15);
        lVar1 = (long)(int)uVar5 + 3;
        uVar18 = 0;
        pcVar13 = pcVar15;
        uVar9 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar9 = uVar18;
        }
        for (; *pcVar13 != '\0'; pcVar13 = pcVar13 + lVar1) {
          cVar16 = '\x01';
          pcVar14 = pcVar13;
          while (cVar16 != '\0') {
            if (pcVar13 != pcVar14) {
              cVar16 = '\0';
              for (uVar17 = 0; uVar9 != uVar17; uVar17 = uVar17 + 1) {
                cVar16 = cVar16 + (pcVar13[uVar17] != pcVar14[uVar17]);
              }
              iVar6 = (int)uVar18;
              uVar18 = (ulong)(iVar6 + 1);
              *(char *)((long)__s + (long)iVar6 + (long)iVar19) = cVar16;
            }
            pcVar2 = pcVar14 + lVar1;
            pcVar14 = pcVar14 + lVar1;
            cVar16 = *pcVar2;
          }
        }
        iVar6 = Abc_SopGetCubeNum(pcVar15);
        iVar19 = iVar19 + (iVar6 * (iVar6 + -1)) / 2;
        if (iVar8 <= iVar4) {
          iVar8 = iVar4;
        }
      }
    }
    if (iVar19 == nPairsTotal) {
      uVar5 = iVar8 * 2;
      __s_00 = (int *)malloc((long)(int)uVar5 << 2);
      memset(__s_00,0xff,(long)(int)uVar5 << 2);
      uVar18 = 0;
      memset(__s_00,0,(long)iVar8 << 3);
      uVar17 = 0;
      if (0 < nPairsTotal) {
        uVar17 = (ulong)(uint)nPairsTotal;
      }
      for (; uVar17 != uVar18; uVar18 = uVar18 + 1) {
        __s_00[*(byte *)((long)__s + uVar18)] = __s_00[*(byte *)((long)__s + uVar18)] + 1;
      }
      if (*__s_00 == 0) {
        if (__s_00[1] == 0) {
          uVar7 = 0;
          uVar18 = (ulong)uVar5;
          if ((int)uVar5 < 1) {
            uVar18 = uVar7;
          }
          iVar8 = 0;
          do {
            if (uVar18 == uVar7) {
              uVar11 = 0xffffffff;
              uVar5 = uVar11;
LAB_003ab666:
              free(__s_00);
              iVar19 = 0;
              iVar8 = 0;
              for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
                if ((int)uVar5 < (int)(uint)*(byte *)((long)__s + uVar18)) {
                  *(undefined1 *)((long)__s + uVar18) = 0;
                }
                else if (uVar5 == *(byte *)((long)__s + uVar18)) {
                  if (iVar8 < (int)uVar11) {
                    iVar19 = iVar19 + 1;
                    iVar8 = iVar8 + 1;
                  }
                  else {
                    *(undefined1 *)((long)__s + uVar18) = 0;
                    iVar8 = iVar8 + 1;
                  }
                }
                else {
                  iVar19 = iVar19 + 1;
                }
              }
              if (iVar19 == nPairsMax) {
                lVar20 = 0;
                iVar8 = 0;
                do {
                  if ((int)uVar9 <= lVar20) {
                    if (iVar8 == nPairsTotal) {
                      free(__s);
                      return 1;
                    }
                    __assert_fail("iPair == nPairsTotal",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                                  ,0xa5,
                                  "int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)"
                                 );
                  }
                  if (vCovers->pArray[lVar20] != (void *)0x0) {
                    pFVar3 = p->ppVars[lVar20 * 2 + 1];
                    pCube1 = pFVar3->pFirst;
                    iVar19 = pFVar3->nCubes;
                    pFVar10 = pCube1;
                    if (iVar19 < 1) {
                      iVar19 = 0;
                    }
                    while (bVar21 = iVar19 != 0, iVar19 = iVar19 + -1, bVar21) {
                      pFVar10 = pFVar10->pNext;
                    }
                    if ((pFVar10 != (Fxu_Cube *)0x0) && (pFVar10->pVar == pFVar3)) {
                      __assert_fail("pCubeLast == NULL || pCubeLast->pVar != pVar",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                                    ,0x9b,
                                    "int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)"
                                   );
                    }
                    for (; pCube1 != pFVar10; pCube1 = pCube1->pNext) {
                      pcVar15 = (char *)((long)iVar8 + (long)__s);
                      ppFVar12 = &pCube1->pNext;
                      while (pCube2 = *ppFVar12, pCube2 != pFVar10) {
                        if (*pcVar15 != '\0') {
                          Fxu_MatrixAddDivisor(p,pCube1,pCube2);
                        }
                        iVar8 = iVar8 + 1;
                        pcVar15 = pcVar15 + 1;
                        ppFVar12 = &pCube2->pNext;
                      }
                    }
                    uVar9 = (ulong)(uint)vCovers->nSize;
                  }
                  lVar20 = lVar20 + 1;
                } while( true );
              }
              __assert_fail("iPair == nPairsMax",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                            ,0x8c,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)"
                           );
            }
            iVar8 = iVar8 + __s_00[uVar7];
            if (nPairsMax <= iVar8) {
              uVar11 = (__s_00[uVar7] + nPairsMax) - iVar8;
              uVar5 = (uint)uVar7;
              goto LAB_003ab666;
            }
            uVar7 = uVar7 + 1;
          } while( true );
        }
        free(__s);
        free(__s_00);
        pcVar15 = "The SOPs of the nodes are not SCC-free. Run \"bdd; sop\" before \"fx\".";
      }
      else {
        free(__s);
        free(__s_00);
        pcVar15 = "The SOPs of the nodes contain duplicated cubes. Run \"bdd; sop\" before \"fx\".";
      }
      puts(pcVar15);
      return 0;
    }
    pcVar15 = "iPair == nPairsTotal";
    uVar5 = 0x56;
  }
  else {
    pcVar15 = "nPairsMax < nPairsTotal";
    uVar5 = 0x43;
  }
  __assert_fail(pcVar15,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                ,uVar5,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
}

Assistant:

int Fxu_PreprocessCubePairs( Fxu_Matrix * p, Vec_Ptr_t * vCovers, int nPairsTotal, int nPairsMax )
{
    unsigned char * pnLitsDiff;   // storage for the counters of diff literals
    int * pnPairCounters;         // the counters of pairs for each number of diff literals
    Fxu_Cube * pCubeFirst, * pCubeLast;
    Fxu_Cube * pCube1, * pCube2;
    Fxu_Var * pVar;
    int nCubes, nBitsMax, nSum;
    int CutOffNum = -1, CutOffQuant = -1; // Suppress "might be used uninitialized"
    int iPair, iQuant, k, c;
//    abctime clk = Abc_Clock();
    char * pSopCover;
    int nFanins;

    assert( nPairsMax < nPairsTotal );

    // allocate storage for counter of diffs
    pnLitsDiff = ABC_FALLOC( unsigned char, nPairsTotal );
    // go through the covers and precompute the distances between the pairs
    iPair    =  0;
    nBitsMax = -1;
    for ( c = 0; c < vCovers->nSize; c++ )
        if ( (pSopCover = (char *)vCovers->pArray[c]) )
        {
            nFanins = Abc_SopGetVarNum(pSopCover);
            // precompute the differences
            Fxu_CountPairDiffs( pSopCover, pnLitsDiff + iPair );
            // update the counter
            nCubes = Abc_SopGetCubeNum( pSopCover );
            iPair += nCubes * (nCubes - 1) / 2;
            if ( nBitsMax < nFanins )
                nBitsMax = nFanins;
        }
    assert( iPair == nPairsTotal );

    // allocate storage for counters of cube pairs by difference
    pnPairCounters = ABC_FALLOC( int, 2 * nBitsMax );
    memset( pnPairCounters, 0, sizeof(int) * 2 * nBitsMax );
    // count the number of different pairs
    for ( k = 0; k < nPairsTotal; k++ )
        pnPairCounters[ pnLitsDiff[k] ]++;
    // determine what pairs to take starting from the lower
    // so that there would be exactly pPairsMax pairs
    if ( pnPairCounters[0] != 0 )
    {
        ABC_FREE( pnLitsDiff );
        ABC_FREE( pnPairCounters );
        printf( "The SOPs of the nodes contain duplicated cubes. Run \"bdd; sop\" before \"fx\".\n" );
        return 0;
    }
    if ( pnPairCounters[1] != 0 )
    {
        ABC_FREE( pnLitsDiff );
        ABC_FREE( pnPairCounters );
        printf( "The SOPs of the nodes are not SCC-free. Run \"bdd; sop\" before \"fx\".\n" );
        return 0;
    }
    assert( pnPairCounters[0] == 0 ); // otherwise, covers are not dup-free
    assert( pnPairCounters[1] == 0 ); // otherwise, covers are not SCC-free
    nSum = 0;
    for ( k = 0; k < 2 * nBitsMax; k++ )
    {
        nSum += pnPairCounters[k];
        if ( nSum >= nPairsMax )
        {
            CutOffNum   = k;
            CutOffQuant = pnPairCounters[k] - (nSum - nPairsMax);
            break;
        }
    }
    ABC_FREE( pnPairCounters );

    // set to 0 all the pairs above the cut-off number and quantity
    iQuant = 0;
    iPair  = 0;
    for ( k = 0; k < nPairsTotal; k++ )
        if ( pnLitsDiff[k] > CutOffNum ) 
            pnLitsDiff[k] = 0;
        else if ( pnLitsDiff[k] == CutOffNum )
        {
            if ( iQuant++ >= CutOffQuant )
                pnLitsDiff[k] = 0;
            else
                iPair++;
        }
        else
            iPair++;
    assert( iPair == nPairsMax );

    // collect the corresponding pairs and add the divisors
    iPair = 0;
    for ( c = 0; c < vCovers->nSize; c++ )
        if ( (pSopCover = (char *)vCovers->pArray[c]) )
        {
            // get the var
            pVar = p->ppVars[2*c+1];
            // get the first cube
            pCubeFirst = pVar->pFirst;
            // get the last cube
            pCubeLast = pCubeFirst;
            for ( k = 0; k < pVar->nCubes; k++ )
                pCubeLast = pCubeLast->pNext;
            assert( pCubeLast == NULL || pCubeLast->pVar != pVar );

            // go through the cube pairs
		    for ( pCube1 = pCubeFirst; pCube1 != pCubeLast; pCube1 = pCube1->pNext )
			    for ( pCube2 = pCube1->pNext; pCube2 != pCubeLast; pCube2 = pCube2->pNext )
                    if ( pnLitsDiff[iPair++] )
                    {   // create the divisors for this pair
	                    Fxu_MatrixAddDivisor( p, pCube1, pCube2 );
                    }
        }
    assert( iPair == nPairsTotal );
    ABC_FREE( pnLitsDiff );
//ABC_PRT( "Preprocess", Abc_Clock() - clk );
    return 1;
}